

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_device_info_add_native_data_format
               (ma_device_info_conflict *pDeviceInfo,ma_format format,ma_uint32 channels,
               ma_uint32 sampleRate,ma_uint32 flags)

{
  uint uVar1;
  ulong uVar2;
  
  if (pDeviceInfo != (ma_device_info_conflict *)0x0) {
    uVar1 = pDeviceInfo->nativeDataFormatCount;
    uVar2 = (ulong)uVar1;
    if (uVar2 < 0x40) {
      pDeviceInfo->nativeDataFormats[uVar2].format = format;
      pDeviceInfo->nativeDataFormats[uVar2].channels = channels;
      pDeviceInfo->nativeDataFormats[uVar2].sampleRate = sampleRate;
      pDeviceInfo->nativeDataFormats[uVar2].flags = flags;
      pDeviceInfo->nativeDataFormatCount = uVar1 + 1;
    }
  }
  return;
}

Assistant:

MA_API void ma_device_info_add_native_data_format(ma_device_info* pDeviceInfo, ma_format format, ma_uint32 channels, ma_uint32 sampleRate, ma_uint32 flags)
{
    if (pDeviceInfo == NULL) {
        return;
    }

    if (pDeviceInfo->nativeDataFormatCount < ma_countof(pDeviceInfo->nativeDataFormats)) {
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].format     = format;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].channels   = channels;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].sampleRate = sampleRate;
        pDeviceInfo->nativeDataFormats[pDeviceInfo->nativeDataFormatCount].flags      = flags;
        pDeviceInfo->nativeDataFormatCount += 1;
    }
}